

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O3

EntryPointPolymorphicInlineCacheInfo * __thiscall
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
          (NativeEntryPointData *this,Recycler *recycler,FunctionBody *functionBody)

{
  Recycler *alloc;
  EntryPointPolymorphicInlineCacheInfo *pEVar1;
  Type *addr;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pEVar1 = (this->polymorphicInlineCacheInfo).ptr;
  if (pEVar1 != (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    return pEVar1;
  }
  addr = &this->polymorphicInlineCacheInfo;
  local_48 = (undefined1  [8])&Js::EntryPointPolymorphicInlineCacheInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_1c5110f;
  data.filename._0_4_ = 0x7f;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  pEVar1 = (EntryPointPolymorphicInlineCacheInfo *)new<Memory::Recycler>(0x38,alloc,0x387914);
  Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo
            (pEVar1,functionBody);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pEVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return addr->ptr;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo * 
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo(Recycler * recycler, FunctionBody * functionBody)
{
    if (!polymorphicInlineCacheInfo)
    {
        polymorphicInlineCacheInfo = RecyclerNew(recycler, EntryPointPolymorphicInlineCacheInfo, functionBody);
    }
    return polymorphicInlineCacheInfo;
}